

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

int __thiscall Process::open(Process *this,char *__file,int __oflag,...)

{
  bool bVar1;
  int iVar2;
  usize uVar3;
  Iterator *pIVar4;
  String *this_00;
  char **ppcVar5;
  undefined8 extraout_RAX;
  uint in_ECX;
  char *local_68;
  Iterator local_60;
  Iterator end;
  Iterator local_48;
  Iterator i;
  Array<const_char_*> argv;
  uint streams_local;
  List<String> *args_local;
  String *executable_local;
  Process *this_local;
  
  uVar3 = List<String>::size(___oflag);
  Array<const_char_*>::Array((Array<const_char_*> *)&i,uVar3);
  pIVar4 = List<String>::begin(___oflag);
  local_48.item = pIVar4->item;
  pIVar4 = List<String>::end(___oflag);
  local_60.item = pIVar4->item;
  while( true ) {
    bVar1 = List<String>::Iterator::operator!=(&local_48,&local_60);
    if (!bVar1) break;
    this_00 = List<String>::Iterator::operator*(&local_48);
    local_68 = String::operator_cast_to_char_(this_00);
    Array<const_char_*>::append((Array<const_char_*> *)&i,&local_68);
    List<String>::Iterator::operator++(&local_48);
  }
  uVar3 = List<String>::size(___oflag);
  ppcVar5 = Array::operator_cast_to_char__((Array *)&i);
  iVar2 = open(this,__file,(int)uVar3,ppcVar5,(ulong)in_ECX);
  Array<const_char_*>::~Array((Array<const_char_*> *)&i);
  return (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),(char)iVar2) & 0xffffff01;
}

Assistant:

bool Process::open(const String& executable, const List<String>& args, uint streams)
{
  Array<const char*> argv(args.size());
  for (List<String>::Iterator i = args.begin(), end = args.end(); i != end; ++i)
    argv.append((const char*)*i);
  return open(executable, (int)args.size(), (char**)(const char**)argv, streams);
}